

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_resolveImportsUsingDifferentAPIModels_Test::
Importer_resolveImportsUsingDifferentAPIModels_Test
          (Importer_resolveImportsUsingDifferentAPIModels_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00168358;
  return;
}

Assistant:

TEST(Importer, resolveImportsUsingDifferentAPIModels)
{
    auto importer = libcellml::Importer::create();

    // Create a source model, and add units and components for use elsewhere.
    auto source1 = libcellml::Model::create("source1");
    source1->addComponent(libcellml::Component::create("componentThatINeed"));
    source1->addUnits(libcellml::Units::create("unitsThatINeed"));
    auto vanilla = libcellml::Variable::create("vanilla");
    source1->component(0)->addVariable(vanilla);

    // Create a model which consumes "componentThatINeed" and "unitsThatINeed".
    auto model = libcellml::Model::create("model");
    model->addComponent(libcellml::Component::create("componentIWillImport"));
    model->addUnits(libcellml::Units::create("unitsThatIWillImport"));
    auto imp1 = libcellml::ImportSource::create();

    imp1->setUrl("flavourOfTheMonth"); // Set URL to be an arbitrary string.
    model->component(0)->setImportSource(imp1); // Set the same import source for both units and component.
    model->units(0)->setImportSource(imp1);
    model->component(0)->setImportReference("componentThatINeed");
    model->units(0)->setImportReference("unitsThatINeed");

    // Add the source model to the importer library, as "flavour of the month".
    importer->addModel(source1, "flavourOfTheMonth");

    // Resolve the model against the importer library and check it contains vanilla.
    importer->resolveImports(model, "");
    EXPECT_EQ(size_t(0), importer->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());
    auto flatModel = importer->flattenModel(model);
    ASSERT_NE(nullptr, flatModel);
    EXPECT_EQ("vanilla", flatModel->component(0)->variable(0)->name());

    // But now the flavour of the month changes, and you have a better definition for componentThatINeed
    // and unitsThatINeed.
    auto source2 = libcellml::Model::create("source2");
    source2->addComponent(libcellml::Component::create("componentThatINeed"));
    source2->addUnits(libcellml::Units::create("unitsThatINeed"));
    auto chocolate = libcellml::Variable::create("chocolate");
    source2->component(0)->addVariable(chocolate);

    // Replace the flavour of the month with the new source model.
    EXPECT_TRUE(importer->replaceModel(source2, "flavourOfTheMonth"));
    // Resolve the model's imports again against the new "flavour".
    importer->clearImports(model);
    EXPECT_TRUE(importer->resolveImports(model, ""));
    EXPECT_EQ(size_t(0), importer->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Check that we now have a variable called "chocolate" in the flattened model.
    auto flatModel2 = importer->flattenModel(model);
    ASSERT_NE(nullptr, flatModel2);
    EXPECT_EQ("chocolate", flatModel2->component(0)->variable(0)->name());
}